

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
                *matrix,vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        *rows)

{
  Column_support *other_node;
  uint uVar1;
  int iVar2;
  pointer pIVar3;
  pointer plVar4;
  node_ptr plVar5;
  node_ptr *pplVar6;
  Index IVar7;
  Field_operators *pFVar8;
  Entry_constructor *pEVar9;
  bool bVar10;
  node_ptr to_erase;
  reference value;
  long lVar11;
  const_node_ptr p;
  Column_support *pCVar12;
  node_ptr plVar13;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r;
  undefined8 *puVar14;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r_1;
  undefined4 local_284;
  undefined *local_280;
  undefined4 *local_278;
  undefined **local_270;
  undefined **local_268;
  char *local_260;
  shared_count sStack_258;
  char *local_250;
  undefined **local_248;
  ulong local_240;
  shared_count sStack_238;
  undefined4 **local_230;
  Delete_disposer local_228;
  undefined1 local_220;
  undefined8 *local_218;
  undefined ***local_210;
  char *local_208;
  char *local_200;
  shared_count sStack_1f8;
  undefined4 **local_1f0;
  char *local_1e8;
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  col;
  Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  moveCol;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  pIVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  col.super_Row_access_option.columnIndex_ = 6;
  col.operators_ = pIVar3->operators_;
  col.entryPool_ = pIVar3->entryPool_;
  other_node = &col.column_;
  puVar14 = *(undefined8 **)&(pIVar3->column_).super_type.data_.root_plus_size_;
  col.super_Row_access_option.rows_ = rows;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)other_node;
  col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)other_node;
  while( true ) {
    if ((Column_support *)puVar14 == &pIVar3->column_) {
      plVar4 = (rows->
               super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      IVar7 = col.super_Row_access_option.columnIndex_;
      pFVar8 = col.operators_;
      pEVar9 = col.entryPool_;
      for (plVar13 = (node_ptr)
                     (rows->
                     super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; plVar13 != (node_ptr)plVar4;
          plVar13 = plVar13 + 1) {
        plVar5 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        col.super_Row_access_option.columnIndex_ = IVar7;
        col.operators_ = pFVar8;
        col.entryPool_ = pEVar9;
        if (plVar13 != plVar5 && plVar5 != (node_ptr)0x0) {
          plVar5 = plVar13->prev_;
          uVar1 = *(uint *)&plVar5[2].next_;
          if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
            local_120 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_118 = "";
            local_130 = &boost::unit_test::basic_cstring<char_const>::null;
            local_128 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
            local_240 = local_240 & 0xffffffffffffff00;
            local_248 = &PTR__lazy_ostream_0020e440;
            sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_230 = (undefined4 **)0x1d01b2;
            iVar2 = *(int *)&plVar5[-1].prev_;
            local_278 = (undefined4 *)CONCAT44(local_278._4_4_,iVar2);
            local_280 = (undefined *)CONCAT44(local_280._4_4_,6);
            local_268 = (undefined **)CONCAT71(local_268._1_7_,iVar2 == 6);
            local_260 = (char *)0x0;
            sStack_258.pi_ = (sp_counted_base *)0x0;
            local_208 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_200 = "";
            local_1f0 = &local_278;
            moveCol.super_Row_access_option.rows_ =
                 (Row_container *)
                 ((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
            moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0020e940;
            moveCol.operators_ = (Field_operators *)&boost::unit_test::lazy_ostream::inst;
            moveCol.entryPool_ = (Entry_constructor *)&local_1f0;
            local_270 = &local_280;
            local_220 = 0;
            local_228.col_ =
                 (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                  *)&PTR__lazy_ostream_0020e6c0;
            local_218 = &boost::unit_test::lazy_ostream::inst;
            local_210 = &local_270;
            boost::test_tools::tt_detail::report_assertion
                      (&local_268,&local_248,&local_208,0x215,1,2,2,"entry.get_column_index()",
                       &moveCol,"6",&local_228);
            boost::detail::shared_count::~shared_count(&sStack_258);
          }
        }
        IVar7 = col.super_Row_access_option.columnIndex_;
        pFVar8 = col.operators_;
        pEVar9 = col.entryPool_;
      }
      col.super_Row_access_option.columnIndex_ = 0;
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
           (node_ptr)&moveCol.column_;
      moveCol.super_Row_access_option.columnIndex_ = IVar7;
      col.operators_ = (Field_operators *)0x0;
      col.entryPool_ = (Entry_constructor *)0x0;
      moveCol.super_Row_access_option.rows_ = col.super_Row_access_option.rows_;
      moveCol.operators_ = pFVar8;
      moveCol.entryPool_ = pEVar9;
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
      boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
      swap_nodes(moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_,
                 (node_ptr)other_node);
      local_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_38 = "";
      local_50 = &boost::unit_test::basic_cstring<char_const>::null;
      local_48 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
      local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
      local_268 = &PTR__lazy_ostream_0020e440;
      sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_250 = "";
      local_280 = (undefined *)0xffffffffffffffff;
      plVar13 = (node_ptr)&moveCol.column_;
      do {
        plVar13 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        local_280 = local_280 + 1;
      } while (plVar13 != (node_ptr)&moveCol.column_);
      local_270 = &local_280;
      local_278 = &local_284;
      local_284 = 4;
      local_200 = (char *)0x0;
      sStack_1f8.pi_ = (sp_counted_base *)0x0;
      local_1f0 = (undefined4 **)0x1d0c9c;
      local_1e8 = "";
      local_210 = &local_270;
      local_220 = 0;
      local_228.col_ =
           (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0020e400;
      local_218 = &boost::unit_test::lazy_ostream::inst;
      local_230 = &local_278;
      local_240 = local_240 & 0xffffffffffffff00;
      local_248 = &PTR__lazy_ostream_0020e6c0;
      sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_208._0_1_ = local_280 == (undefined *)0x4;
      boost::test_tools::tt_detail::report_assertion
                (&local_208,&local_268,&local_1f0,0x21c,1,2,2,"moveCol.size()",&local_228,"4",
                 &local_248);
      boost::detail::shared_count::~shared_count(&sStack_1f8);
      local_60 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_58 = "";
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_68 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
      local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
      local_268 = &PTR__lazy_ostream_0020e440;
      sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_250 = "";
      lVar11 = 1;
      pCVar12 = other_node;
      do {
        pCVar12 = (Column_support *)
                  (pCVar12->super_type).data_.root_plus_size_.m_header.super_node.next_;
        lVar11 = lVar11 + -1;
      } while (pCVar12 != other_node);
      local_280 = (undefined *)-lVar11;
      local_284 = 0;
      local_208 = (char *)CONCAT71(local_208._1_7_,lVar11 == 0);
      local_200 = (char *)0x0;
      sStack_1f8.pi_ = (sp_counted_base *)0x0;
      local_1f0 = (undefined4 **)0x1d0c9c;
      local_1e8 = "";
      local_270 = &local_280;
      local_220 = 0;
      local_228.col_ =
           (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0020e400;
      local_218 = &boost::unit_test::lazy_ostream::inst;
      local_210 = &local_270;
      local_278 = &local_284;
      local_240 = local_240 & 0xffffffffffffff00;
      local_248 = &PTR__lazy_ostream_0020e6c0;
      sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_230 = &local_278;
      boost::test_tools::tt_detail::report_assertion
                (&local_208,&local_268,&local_1f0,0x21d,1,2,2,"col.size()",&local_228,"0",&local_248
                );
      boost::detail::shared_count::~shared_count(&sStack_1f8);
      local_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_78 = "";
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_88 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
      bVar10 = Gudhi::persistence_matrix::operator==
                         ((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,&moveCol);
      local_248 = (undefined **)CONCAT71(local_248._1_7_,bVar10);
      local_240 = 0;
      sStack_238.pi_ = (sp_counted_base *)0x0;
      local_268 = (undefined **)0x1dae98;
      local_260 = "";
      local_220 = 0;
      local_228.col_ =
           (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0020e388;
      local_218 = &boost::unit_test::lazy_ostream::inst;
      local_a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_98 = "";
      local_210 = &local_268;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_238);
      plVar4 = (rows->
               super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (plVar13 = (node_ptr)
                     (rows->
                     super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; plVar13 != (node_ptr)plVar4;
          plVar13 = plVar13 + 1) {
        plVar5 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        if (plVar13 != plVar5 && plVar5 != (node_ptr)0x0) {
          plVar5 = plVar13->prev_;
          uVar1 = *(uint *)&plVar5[2].next_;
          if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
            local_140 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_138 = "";
            local_150 = &boost::unit_test::basic_cstring<char_const>::null;
            local_148 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                       &local_150);
            local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
            local_268 = &PTR__lazy_ostream_0020e440;
            sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_250 = "";
            iVar2 = *(int *)&plVar5[-1].prev_;
            local_280 = (undefined *)CONCAT44(local_280._4_4_,iVar2);
            local_284 = 6;
            local_208 = (char *)CONCAT71(local_208._1_7_,iVar2 == 6);
            local_200 = (char *)0x0;
            sStack_1f8.pi_ = (sp_counted_base *)0x0;
            local_1f0 = (undefined4 **)0x1d0c9c;
            local_1e8 = "";
            local_270 = &local_280;
            local_220 = 0;
            local_228.col_ =
                 (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                  *)&PTR__lazy_ostream_0020e940;
            local_218 = &boost::unit_test::lazy_ostream::inst;
            local_210 = &local_270;
            local_278 = &local_284;
            local_240 = local_240 & 0xffffffffffffff00;
            local_248 = &PTR__lazy_ostream_0020e6c0;
            sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_230 = &local_278;
            boost::test_tools::tt_detail::report_assertion
                      (&local_208,&local_268,&local_1f0,0x22d,1,2,2,"entry.get_column_index()",
                       &local_228,"6",&local_248);
            boost::detail::shared_count::~shared_count(&sStack_1f8);
          }
        }
      }
      Gudhi::persistence_matrix::swap(&col,&moveCol);
      local_b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_a8 = "";
      local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
      local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
      local_268 = &PTR__lazy_ostream_0020e440;
      sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_250 = "";
      lVar11 = 1;
      plVar13 = (node_ptr)&moveCol.column_;
      do {
        plVar13 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        lVar11 = lVar11 + -1;
      } while (plVar13 != (node_ptr)&moveCol.column_);
      local_280 = (undefined *)-lVar11;
      local_284 = 0;
      local_200 = (char *)0x0;
      sStack_1f8.pi_ = (sp_counted_base *)0x0;
      local_1f0 = (undefined4 **)0x1d0c9c;
      local_1e8 = "";
      local_270 = &local_280;
      local_220 = 0;
      local_228.col_ =
           (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0020e400;
      local_218 = &boost::unit_test::lazy_ostream::inst;
      local_210 = &local_270;
      local_278 = &local_284;
      local_240 = local_240 & 0xffffffffffffff00;
      local_248 = &PTR__lazy_ostream_0020e6c0;
      sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_230 = &local_278;
      local_208._0_1_ = lVar11 == 0;
      boost::test_tools::tt_detail::report_assertion
                (&local_208,&local_268,&local_1f0,0x234,1,2,2,"moveCol.size()",&local_228,"0",
                 &local_248);
      boost::detail::shared_count::~shared_count(&sStack_1f8);
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_c8 = "";
      local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
      local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
      local_268 = &PTR__lazy_ostream_0020e440;
      sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_250 = "";
      local_280 = (undefined *)0xffffffffffffffff;
      plVar13 = (node_ptr)&col.column_;
      do {
        plVar13 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        local_280 = local_280 + 1;
      } while (plVar13 != (node_ptr)&col.column_);
      local_284 = 4;
      local_208 = (char *)CONCAT71(local_208._1_7_,local_280 == (undefined *)0x4);
      local_200 = (char *)0x0;
      sStack_1f8.pi_ = (sp_counted_base *)0x0;
      local_1f0 = (undefined4 **)0x1d0c9c;
      local_1e8 = "";
      local_270 = &local_280;
      local_220 = 0;
      local_228.col_ =
           (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0020e400;
      local_218 = &boost::unit_test::lazy_ostream::inst;
      local_210 = &local_270;
      local_278 = &local_284;
      local_240 = local_240 & 0xffffffffffffff00;
      local_248 = &PTR__lazy_ostream_0020e6c0;
      sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_230 = &local_278;
      boost::test_tools::tt_detail::report_assertion
                (&local_208,&local_268,&local_1f0,0x235,1,2,2,"col.size()",&local_228,"4",&local_248
                );
      boost::detail::shared_count::~shared_count(&sStack_1f8);
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_e8 = "";
      local_100 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
      bVar10 = Gudhi::persistence_matrix::operator==
                         ((matrix->
                          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,&col);
      local_248 = (undefined **)CONCAT71(local_248._1_7_,bVar10);
      local_240 = 0;
      sStack_238.pi_ = (sp_counted_base *)0x0;
      local_268 = (undefined **)0x1daead;
      local_260 = "";
      local_220 = 0;
      local_228.col_ =
           (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            *)&PTR__lazy_ostream_0020e388;
      local_218 = &boost::unit_test::lazy_ostream::inst;
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
      ;
      local_108 = "";
      local_210 = &local_268;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_238);
      plVar4 = (rows->
               super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (plVar13 = (node_ptr)
                     (rows->
                     super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; plVar13 != (node_ptr)plVar4;
          plVar13 = plVar13 + 1) {
        plVar5 = (((type *)&plVar13->next_)->data_).root_plus_size_.m_header.super_node.next_;
        if (plVar13 != plVar5 && plVar5 != (node_ptr)0x0) {
          plVar5 = plVar13->prev_;
          uVar1 = *(uint *)&plVar5[2].next_;
          if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
            local_160 = 
            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
            ;
            local_158 = "";
            local_170 = &boost::unit_test::basic_cstring<char_const>::null;
            local_168 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                       &local_170);
            local_260 = (char *)((ulong)local_260 & 0xffffffffffffff00);
            local_268 = &PTR__lazy_ostream_0020e440;
            sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_250 = "";
            iVar2 = *(int *)&plVar5[-1].prev_;
            local_280 = (undefined *)CONCAT44(local_280._4_4_,iVar2);
            local_284 = 6;
            local_208 = (char *)CONCAT71(local_208._1_7_,iVar2 == 6);
            local_200 = (char *)0x0;
            sStack_1f8.pi_ = (sp_counted_base *)0x0;
            local_1f0 = (undefined4 **)0x1d0c9c;
            local_1e8 = "";
            local_270 = &local_280;
            local_220 = 0;
            local_228.col_ =
                 (Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                  *)&PTR__lazy_ostream_0020e940;
            local_218 = &boost::unit_test::lazy_ostream::inst;
            local_210 = &local_270;
            local_278 = &local_284;
            local_240 = local_240 & 0xffffffffffffff00;
            local_248 = &PTR__lazy_ostream_0020e6c0;
            sStack_238.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
            local_230 = &local_278;
            boost::test_tools::tt_detail::report_assertion
                      (&local_208,&local_268,&local_1f0,0x245,1,2,2,"entry.get_column_index()",
                       &local_228,"6",&local_248);
            boost::detail::shared_count::~shared_count(&sStack_1f8);
          }
        }
      }
      local_228.col_ = &moveCol;
      if (moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
          (node_ptr)&moveCol.column_) {
        plVar13 = moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
        do {
          plVar5 = plVar13->next_;
          plVar13->next_ = (node_ptr)0x0;
          plVar13->prev_ = (node_ptr)0x0;
          Gudhi::persistence_matrix::
          Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
          ::Delete_disposer::operator()(&local_228,(Entry *)&plVar13[-2].prev_);
          plVar13 = plVar5;
        } while (plVar5 != (node_ptr)&moveCol.column_);
      }
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
      moveCol.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
      moveCol.super_Row_access_option._0_8_ = &col;
      if (col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ !=
          (node_ptr)&col.column_) {
        plVar13 = col.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
        do {
          plVar5 = plVar13->next_;
          plVar13->next_ = (node_ptr)0x0;
          plVar13->prev_ = (node_ptr)0x0;
          Gudhi::persistence_matrix::
          Intrusive_list_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
          ::Delete_disposer::operator()((Delete_disposer *)&moveCol,(Entry *)&plVar13[-2].prev_);
          plVar13 = plVar5;
        } while (plVar5 != (node_ptr)&col.column_);
      }
      return;
    }
    uVar1 = *(uint *)(puVar14 + 2);
    value = (reference)operator_new(0x30);
    (value->super_Entry_column_index_option).columnIndex_ = col.super_Row_access_option.columnIndex_
    ;
    (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    value->rowIndex_ = uVar1;
    if ((value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
        (node_ptr)0x0) break;
    (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
         col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
         (node_ptr)other_node;
    pplVar6 = &(col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_)->next_;
    col.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&value->super_Column_hook;
    *pplVar6 = (node_ptr)&value->super_Column_hook;
    if (col.super_Row_access_option.rows_ != (Row_container *)0x0) {
      if ((ulong)((long)((col.super_Row_access_option.rows_)->
                        super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)((col.super_Row_access_option.rows_)->
                        super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)(uVar1 + 1)) {
        std::
        vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
        ::resize(col.super_Row_access_option.rows_,(ulong)(uVar1 + 1));
      }
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
      ::push_back(&((col.super_Row_access_option.rows_)->
                   super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar1].super_type,value);
    }
    puVar14 = (undefined8 *)*puVar14;
  }
  __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                "/usr/include/boost/intrusive/list.hpp",0x33c,
                "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
               );
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}